

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int map_item_compare(void *lhs,void *rhs)

{
  size_t local_40;
  int local_34;
  int cmp;
  size_t min_len;
  wally_map_item *r;
  wally_map_item *l;
  void *rhs_local;
  void *lhs_local;
  
  if (*(ulong *)((long)lhs + 8) < *(ulong *)((long)rhs + 8)) {
    local_40 = *(size_t *)((long)lhs + 8);
  }
  else {
    local_40 = *(size_t *)((long)rhs + 8);
  }
  local_34 = memcmp(*lhs,*rhs,local_40);
  if ((local_34 == 0) && (local_34 = 1, *(ulong *)((long)lhs + 8) < *(ulong *)((long)rhs + 8))) {
    local_34 = -1;
  }
  return local_34;
}

Assistant:

static int map_item_compare(const void *lhs, const void *rhs)
{
    const struct wally_map_item *l = lhs, *r = rhs;
    const size_t min_len = l->key_len < r->key_len ? l->key_len : r->key_len;
    int cmp;

    cmp = memcmp(l->key, r->key, min_len);
    if (cmp == 0) {
        /* Equal up to the min length, longest key is greater. If we have
         * duplicate keys somehow, the resulting order is undefined */
        cmp = l->key_len < r->key_len ? -1 : 1;
    }
    return cmp;
}